

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

void __thiscall
front::irGenerator::irGenerator::ir_op
          (irGenerator *this,LeftVal *dest,RightVal *op1,RightVal *op2,Op op)

{
  LabelId LVar1;
  LeftVal *in_RCX;
  OpInst *in_RDX;
  VarId *in_RSI;
  irGenerator *in_RDI;
  shared_ptr<mir::inst::OpInst> opInst;
  shared_ptr<mir::inst::Value> op2Value;
  shared_ptr<mir::inst::Value> op1Value;
  shared_ptr<mir::inst::VarId> destVarId;
  undefined4 in_stack_fffffffffffffe38;
  uint32_t in_stack_fffffffffffffe3c;
  Value *in_stack_fffffffffffffe40;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *this_00;
  Op _op;
  key_type *__k;
  undefined4 in_stack_fffffffffffffe80;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  local_150 [2];
  RightVal *in_stack_fffffffffffffef0;
  irGenerator *in_stack_fffffffffffffef8;
  undefined1 local_c8 [23];
  undefined1 local_b1;
  key_type local_78 [3];
  
  std::shared_ptr<mir::inst::VarId>::shared_ptr((shared_ptr<mir::inst::VarId> *)0x25ca08);
  std::shared_ptr<mir::inst::Value>::shared_ptr((shared_ptr<mir::inst::Value> *)0x25ca15);
  std::shared_ptr<mir::inst::Value>::shared_ptr((shared_ptr<mir::inst::Value> *)0x25ca22);
  std::shared_ptr<mir::inst::OpInst>::shared_ptr((shared_ptr<mir::inst::OpInst> *)0x25ca2f);
  operator_new(0x10);
  local_b1 = 1;
  std::
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)in_stack_fffffffffffffe40,
          (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  LVar1 = LeftValueToLabelId(in_RDI,in_RCX);
  mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
  local_b1 = 0;
  std::shared_ptr<mir::inst::VarId>::shared_ptr<mir::inst::VarId,void>
            ((shared_ptr<mir::inst::VarId> *)in_stack_fffffffffffffe40,
             (VarId *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  __k = local_78;
  std::shared_ptr<mir::inst::VarId>::operator=
            ((shared_ptr<mir::inst::VarId> *)in_stack_fffffffffffffe40,
             (shared_ptr<mir::inst::VarId> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::shared_ptr<mir::inst::VarId>::~shared_ptr((shared_ptr<mir::inst::VarId> *)0x25cac4);
  std::
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x25cad1);
  rightValueToValue(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  _op = (Op)((ulong)local_c8 >> 0x20);
  std::shared_ptr<mir::inst::Value>::operator=
            ((shared_ptr<mir::inst::Value> *)in_stack_fffffffffffffe40,
             (shared_ptr<mir::inst::Value> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::shared_ptr<mir::inst::Value>::~shared_ptr((shared_ptr<mir::inst::Value> *)0x25cb0e);
  rightValueToValue(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::shared_ptr<mir::inst::Value>::operator=
            ((shared_ptr<mir::inst::Value> *)in_stack_fffffffffffffe40,
             (shared_ptr<mir::inst::Value> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::shared_ptr<mir::inst::Value>::~shared_ptr((shared_ptr<mir::inst::Value> *)0x25cb4b);
  operator_new(0x60);
  std::__shared_ptr_access<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffe40);
  mir::inst::VarId::VarId
            ((VarId *)in_stack_fffffffffffffe40,
             (VarId *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::__shared_ptr_access<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffe40);
  mir::inst::Value::Value
            (in_stack_fffffffffffffe40,
             (Value *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::__shared_ptr_access<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffe40);
  mir::inst::Value::Value
            (in_stack_fffffffffffffe40,
             (Value *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  mir::inst::OpInst::OpInst
            (in_RDX,in_RSI,(Value *)CONCAT44(LVar1,in_stack_fffffffffffffe80),(Value *)__k,_op);
  std::shared_ptr<mir::inst::OpInst>::shared_ptr<mir::inst::OpInst,void>
            ((shared_ptr<mir::inst::OpInst> *)in_stack_fffffffffffffe40,
             (OpInst *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::shared_ptr<mir::inst::OpInst>::operator=
            ((shared_ptr<mir::inst::OpInst> *)in_stack_fffffffffffffe40,
             (shared_ptr<mir::inst::OpInst> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::shared_ptr<mir::inst::OpInst>::~shared_ptr((shared_ptr<mir::inst::OpInst> *)0x25cc1b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffe40);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
                *)CONCAT44(LVar1,in_stack_fffffffffffffe80),__k);
  this_00 = local_150;
  std::
  variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
  ::variant<std::shared_ptr<mir::inst::OpInst>&,void,void,std::shared_ptr<mir::inst::Inst>,void>
            (this_00,(shared_ptr<mir::inst::OpInst> *)
                     CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
  ::push_back((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
               *)this_00,(value_type *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
             );
  std::
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  ::~variant((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              *)0x25cc7e);
  std::shared_ptr<mir::inst::OpInst>::~shared_ptr((shared_ptr<mir::inst::OpInst> *)0x25cc8b);
  std::shared_ptr<mir::inst::Value>::~shared_ptr((shared_ptr<mir::inst::Value> *)0x25cc98);
  std::shared_ptr<mir::inst::Value>::~shared_ptr((shared_ptr<mir::inst::Value> *)0x25cca5);
  std::shared_ptr<mir::inst::VarId>::~shared_ptr((shared_ptr<mir::inst::VarId> *)0x25ccb2);
  return;
}

Assistant:

void irGenerator::ir_op(LeftVal dest, RightVal op1, RightVal op2,
                        mir::inst::Op op) {
  shared_ptr<VarId> destVarId;
  shared_ptr<Value> op1Value;
  shared_ptr<Value> op2Value;
  shared_ptr<mir::inst::OpInst> opInst;

  destVarId = shared_ptr<VarId>(new VarId(LeftValueToLabelId(dest)));
  op1Value = rightValueToValue(op1);
  op2Value = rightValueToValue(op2);

  opInst = shared_ptr<mir::inst::OpInst>(
      new mir::inst::OpInst(*destVarId, *op1Value, *op2Value, op));

  _funcNameToInstructions[_funcStack.back()].push_back(opInst);
}